

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error ps_parser_to_bytes(PS_Parser parser,FT_Byte *bytes,FT_Offset max_bytes,FT_ULong *pnum_bytes
                           ,FT_Bool delimiters)

{
  FT_Byte *limit;
  FT_UInt FVar1;
  FT_Byte *cur;
  FT_Byte *local_38;
  
  skip_spaces(&parser->cursor,parser->limit);
  local_38 = parser->cursor;
  limit = parser->limit;
  if (limit <= local_38) {
    return 0;
  }
  if (delimiters == '\0') {
    FVar1 = PS_Conv_ASCIIHexDecode(&local_38,limit,bytes,max_bytes);
    *pnum_bytes = (ulong)FVar1;
  }
  else {
    if (*local_38 != '<') {
      return 3;
    }
    local_38 = local_38 + 1;
    FVar1 = PS_Conv_ASCIIHexDecode(&local_38,limit,bytes,max_bytes);
    *pnum_bytes = (ulong)FVar1;
    parser->cursor = local_38;
    if ((local_38 < parser->limit) && (*local_38 != '>')) {
      return 3;
    }
    local_38 = local_38 + 1;
  }
  parser->cursor = local_38;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_to_bytes( PS_Parser  parser,
                      FT_Byte*   bytes,
                      FT_Offset  max_bytes,
                      FT_ULong*  pnum_bytes,
                      FT_Bool    delimiters )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  cur;


    ps_parser_skip_spaces( parser );
    cur = parser->cursor;

    if ( cur >= parser->limit )
      goto Exit;

    if ( delimiters )
    {
      if ( *cur != '<' )
      {
        FT_ERROR(( "ps_parser_to_bytes: Missing starting delimiter `<'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      cur++;
    }

    *pnum_bytes = PS_Conv_ASCIIHexDecode( &cur,
                                          parser->limit,
                                          bytes,
                                          max_bytes );

    parser->cursor = cur;

    if ( delimiters )
    {
      if ( cur < parser->limit && *cur != '>' )
      {
        FT_ERROR(( "ps_parser_to_bytes: Missing closing delimiter `>'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      parser->cursor++;
    }

  Exit:
    return error;
  }